

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O1

int LZ4_decompress_safe_withPrefix64k(char *source,char *dest,int compressedSize,int maxOutputSize)

{
  ushort *puVar1;
  ushort *puVar2;
  undefined8 *puVar3;
  byte bVar4;
  undefined8 uVar5;
  ushort uVar6;
  ushort uVar7;
  U32 length;
  uint uVar8;
  int iVar9;
  ushort *puVar10;
  ulong uVar11;
  char cVar12;
  uint uVar13;
  long lVar14;
  ushort *puVar15;
  long lVar16;
  ulong uVar17;
  byte *pbVar18;
  byte *pbVar19;
  long lVar20;
  BYTE *d_2;
  ushort *puVar21;
  BYTE *d;
  ushort *puVar22;
  ushort *puVar23;
  BYTE *s;
  ushort *puVar24;
  ulong uStack_90;
  
  puVar24 = (ushort *)0xffffffffffffffff;
  if (source != (char *)0x0) {
    if (maxOutputSize == 0) {
      if (compressedSize == 1) {
        puVar24 = (ushort *)(ulong)-(uint)(*source != '\0');
      }
    }
    else if (compressedSize != 0) {
      puVar1 = (ushort *)(source + compressedSize);
      puVar2 = (ushort *)(dest + maxOutputSize);
      puVar23 = (ushort *)dest;
      puVar24 = (ushort *)source;
      if (maxOutputSize < 0x40) goto LAB_00103492;
      puVar15 = (ushort *)((long)puVar1 + -0xf);
      lVar16 = 0;
      puVar23 = (ushort *)(source + (long)compressedSize + -0x10);
      puVar10 = (ushort *)source;
LAB_00102fa5:
      puVar22 = puVar23;
      iVar9 = 5;
      puVar23 = (ushort *)(dest + lVar16);
      bVar4 = (byte)*puVar10;
      uVar8 = (uint)bVar4;
      puVar24 = (ushort *)((long)puVar10 + 1);
      uVar17 = (ulong)(uint)(bVar4 >> 4);
      if (bVar4 >> 4 == 0xf) {
        uVar17 = 0xf;
        puVar10 = puVar24;
        if (puVar24 < puVar15) {
          uVar13 = 0;
          do {
            uVar6 = *puVar10;
            puVar10 = (ushort *)((long)puVar10 + 1);
            uVar13 = uVar13 + (byte)uVar6;
          } while (puVar10 < puVar15 && (byte)uVar6 == 0xff);
          uVar17 = (ulong)uVar13 + 0xf;
        }
        lVar20 = lVar16;
        if (((puVar24 < puVar15) && (!CARRY8((ulong)puVar23,uVar17))) &&
           (!CARRY8((ulong)puVar10,uVar17))) {
          puVar22 = (ushort *)(dest + lVar16 + uVar17);
          if ((puVar2 + -0x10 < puVar22) || (puVar1 + -0x10 < (ushort *)((long)puVar10 + uVar17))) {
            iVar9 = 6;
          }
          else {
            lVar20 = 0;
            do {
              uVar5 = *(undefined8 *)((byte *)((long)puVar10 + lVar20) + 8);
              pbVar18 = (byte *)((long)puVar23 + lVar20);
              *(undefined8 *)pbVar18 = *(undefined8 *)((long)puVar10 + lVar20);
              *(undefined8 *)(pbVar18 + 8) = uVar5;
              pbVar19 = (byte *)((long)puVar10 + lVar20 + 0x10);
              uVar5 = *(undefined8 *)(pbVar19 + 8);
              *(undefined8 *)(pbVar18 + 0x10) = *(undefined8 *)pbVar19;
              *(undefined8 *)(pbVar18 + 0x18) = uVar5;
              lVar20 = lVar20 + 0x20;
            } while (pbVar18 + 0x20 < puVar22);
            iVar9 = 0;
            puVar10 = (ushort *)((long)puVar10 + uVar17);
            lVar20 = lVar16 + uVar17;
          }
        }
        puVar23 = puVar22;
        if (iVar9 != 0) {
          if (iVar9 == 5) goto LAB_00103568;
          if (iVar9 != 6) goto LAB_0010327f;
          puVar23 = (ushort *)(dest + lVar20);
          puVar24 = puVar10;
LAB_00103389:
          while ((puVar15 = (ushort *)((long)puVar24 + uVar17), puVar22 <= puVar2 + -6 &&
                 (puVar15 <= puVar1 + -4))) {
            do {
              *(undefined8 *)puVar23 = *(undefined8 *)puVar24;
              puVar23 = puVar23 + 4;
              puVar24 = puVar24 + 4;
            } while (puVar23 < puVar22);
            uVar11 = (ulong)*puVar15;
            puVar24 = puVar15 + 1;
            pbVar18 = (byte *)((long)puVar22 - uVar11);
            uStack_90 = (ulong)(uVar8 & 0xf);
LAB_001033d6:
            if ((int)uStack_90 == 0xf) {
              uVar8 = 0;
              do {
                uVar6 = *puVar24;
                puVar24 = (ushort *)((long)puVar24 + 1);
                uVar8 = uVar8 + (byte)uVar6;
              } while (puVar24 < puVar1 + -2 && (byte)uVar6 == 0xff);
              uStack_90 = (ulong)uVar8 + 0xf;
              cVar12 = '\x05';
              if (puVar24 < puVar1 + -2) {
                cVar12 = CARRY8((ulong)puVar22,uStack_90) * '\x05';
              }
              if (cVar12 != '\0') {
                puVar10 = puVar24;
                if (cVar12 == '\x05') goto LAB_00103568;
                goto LAB_0010327f;
              }
            }
            uStack_90 = uStack_90 + 4;
LAB_0010342c:
            puVar10 = puVar24;
            if (pbVar18 < dest + -0x10000) goto LAB_00103568;
            puVar23 = (ushort *)((long)puVar22 + uStack_90);
            if ((uint)uVar11 < 8) {
              puVar22[0] = 0;
              puVar22[1] = 0;
              *(byte *)puVar22 = *pbVar18;
              *(byte *)((long)puVar22 + 1) = pbVar18[1];
              *(byte *)(puVar22 + 1) = pbVar18[2];
              *(byte *)((long)puVar22 + 3) = pbVar18[3];
              uVar17 = (ulong)((uint)uVar11 << 2);
              uVar11 = (ulong)*(uint *)((long)inc32table + uVar17);
              *(undefined4 *)(puVar22 + 2) = *(undefined4 *)(pbVar18 + uVar11);
              pbVar18 = pbVar18 + (uVar11 - (long)*(int *)((long)dec64table + uVar17));
            }
            else {
              *(undefined8 *)puVar22 = *(undefined8 *)pbVar18;
              pbVar18 = pbVar18 + 8;
            }
            puVar15 = puVar22 + 4;
            if (puVar2 + -6 < puVar23) {
              iVar9 = 5;
              if (puVar23 <= (ushort *)((long)puVar2 + -5)) {
                puVar22 = (ushort *)((long)puVar2 + -7);
                pbVar19 = pbVar18;
                puVar21 = puVar15;
                if (puVar15 < puVar22) {
                  do {
                    *(undefined8 *)puVar21 = *(undefined8 *)pbVar19;
                    puVar21 = puVar21 + 4;
                    pbVar19 = pbVar19 + 8;
                  } while (puVar21 < puVar22);
                  pbVar18 = pbVar18 + ((long)puVar22 - (long)puVar15);
                  puVar15 = puVar22;
                }
                iVar9 = 0;
                for (; puVar15 < puVar23; puVar15 = (ushort *)((long)puVar15 + 1)) {
                  bVar4 = *pbVar18;
                  pbVar18 = pbVar18 + 1;
                  *(byte *)puVar15 = bVar4;
                }
              }
              if (iVar9 != 0) {
                if (iVar9 == 5) goto LAB_00103568;
                goto LAB_0010327f;
              }
            }
            else {
              *(undefined8 *)puVar15 = *(undefined8 *)pbVar18;
              if (0x10 < uStack_90) {
                puVar22 = puVar22 + 8;
                do {
                  pbVar18 = pbVar18 + 8;
                  *(undefined8 *)puVar22 = *(undefined8 *)pbVar18;
                  puVar22 = puVar22 + 4;
                } while (puVar22 < puVar23);
              }
            }
LAB_00103492:
            bVar4 = (byte)*puVar24;
            puVar15 = (ushort *)((long)puVar24 + 1);
LAB_00103291:
            uVar8 = (uint)bVar4;
            if (bVar4 >> 4 != 0xf) {
              uVar17 = (ulong)(uint)(bVar4 >> 4);
              if ((source + (long)compressedSize + -0x10 <= puVar15) ||
                 (dest + (long)maxOutputSize + -0x20 < puVar23)) goto LAB_00103385;
              uVar5 = *(undefined8 *)(puVar15 + 4);
              *(undefined8 *)puVar23 = *(undefined8 *)puVar15;
              *(undefined8 *)(puVar23 + 4) = uVar5;
              puVar22 = (ushort *)((long)puVar23 + uVar17);
              uStack_90 = (ulong)(uVar8 & 0xf);
              puVar24 = (ushort *)((long)puVar15 + uVar17) + 1;
              uVar6 = *(ushort *)((long)puVar15 + uVar17);
              uVar11 = (ulong)uVar6;
              pbVar18 = (byte *)((long)puVar22 - uVar11);
              if (((uVar8 & 0xf) != 0xf) && (7 < uVar6)) goto code_r0x001032e6;
              goto LAB_001033d6;
            }
            puVar24 = (ushort *)((long)puVar1 + -0xf);
            uVar17 = 0xf;
            puVar10 = puVar15;
            if (puVar15 < puVar24) {
              uVar13 = 0;
              do {
                uVar6 = *puVar10;
                puVar10 = (ushort *)((long)puVar10 + 1);
                uVar13 = uVar13 + (byte)uVar6;
              } while (puVar10 < puVar24 && (byte)uVar6 == 0xff);
              uVar17 = (ulong)uVar13 + 0xf;
            }
            if (((puVar24 <= puVar15) || (CARRY8((ulong)puVar23,uVar17))) ||
               (puVar15 = puVar10, CARRY8((ulong)puVar10,uVar17))) goto LAB_00103568;
LAB_00103385:
            puVar22 = (ushort *)((long)puVar23 + uVar17);
            puVar24 = puVar15;
          }
          puVar10 = puVar24;
          if ((puVar15 == puVar1) && (puVar22 <= puVar2)) {
            memmove(puVar23,puVar24,uVar17);
            puVar24 = (ushort *)(ulong)(uint)(((int)puVar23 + (int)uVar17) - (int)dest);
          }
          else {
LAB_00103568:
            puVar24 = (ushort *)(ulong)(~(uint)puVar10 + (int)source);
          }
          goto LAB_0010327f;
        }
      }
      else {
        lVar20 = lVar16 + uVar17;
        puVar22 = (ushort *)(dest + lVar20);
        if ((ushort *)((long)puVar1 + -0x11) < puVar24) goto LAB_00103389;
        uVar5 = *(undefined8 *)((long)puVar10 + 9);
        *(undefined8 *)puVar23 = *(undefined8 *)puVar24;
        *(undefined8 *)(puVar23 + 4) = uVar5;
        puVar10 = (ushort *)(uVar17 + (long)puVar24);
        puVar23 = puVar22;
      }
      puVar22 = (ushort *)(dest + lVar20);
      uVar6 = *puVar10;
      uVar11 = (ulong)uVar6;
      puVar24 = puVar10 + 1;
      lVar14 = lVar20 - uVar11;
      pbVar18 = (byte *)(dest + lVar14);
      uStack_90 = (ulong)(bVar4 & 0xf);
      if (uStack_90 == 0xf) {
        if (lVar14 < -0x10000) {
          iVar9 = 5;
          uStack_90 = 0xf;
        }
        else {
          uVar8 = 0;
          do {
            uVar7 = *puVar24;
            puVar24 = (ushort *)((long)puVar24 + 1);
            uVar8 = uVar8 + (byte)uVar7;
          } while ((byte)uVar7 == 0xff && puVar24 < puVar1 + -2);
          uVar17 = (ulong)uVar8;
          uStack_90 = uVar17 + 0xf;
          if ((puVar1 + -2 <= puVar24) || (CARRY8((ulong)puVar22,uStack_90))) {
            iVar9 = 5;
          }
          else {
            uStack_90 = uVar17 + 0x13;
            iVar9 = 7;
            if ((ushort *)((long)puVar22 + uVar17 + 0x13) < puVar2 + -0x20) {
              iVar9 = 0;
            }
          }
        }
        if (iVar9 != 0) {
          puVar10 = puVar24;
          if (iVar9 != 5) {
            if (iVar9 == 7) goto LAB_0010342c;
            goto LAB_0010327f;
          }
          goto LAB_00103568;
        }
LAB_0010315c:
        puVar10 = puVar24;
        if (lVar14 < -0x10000) goto LAB_00103568;
        lVar16 = lVar20 + uStack_90;
        puVar23 = (ushort *)(dest + lVar16);
        if (uVar6 < 0x10) {
          LZ4_memcpy_using_offset((BYTE *)puVar22,pbVar18,(BYTE *)puVar23,uVar11);
        }
        else {
          do {
            puVar3 = (undefined8 *)((long)puVar22 + -uVar11);
            uVar5 = puVar3[1];
            *(undefined8 *)puVar22 = *puVar3;
            *(undefined8 *)(puVar22 + 4) = uVar5;
            pbVar18 = (byte *)((long)puVar22 + -uVar11 + 0x10);
            uVar5 = *(undefined8 *)(pbVar18 + 8);
            *(undefined8 *)(puVar22 + 8) = *(undefined8 *)pbVar18;
            *(undefined8 *)(puVar22 + 0xc) = uVar5;
            puVar22 = puVar22 + 0x10;
          } while (puVar22 < puVar23);
        }
      }
      else {
        lVar16 = lVar20 + uStack_90 + 4;
        uStack_90 = uStack_90 + 4;
        if (puVar2 + -0x20 <= dest + lVar16) goto LAB_0010342c;
        if (uVar6 < 8) goto LAB_0010315c;
        *(undefined8 *)puVar22 = *(undefined8 *)pbVar18;
        *(undefined8 *)(puVar22 + 4) = *(undefined8 *)(pbVar18 + 8);
        puVar22[8] = *(ushort *)(pbVar18 + 0x10);
        puVar10 = puVar24;
      }
      goto LAB_00102fa5;
    }
  }
LAB_0010327f:
  return (int)puVar24;
code_r0x001032e6:
  *(undefined8 *)puVar22 = *(undefined8 *)pbVar18;
  *(undefined8 *)(puVar22 + 4) = *(undefined8 *)(pbVar18 + 8);
  puVar22[8] = *(ushort *)(pbVar18 + 0x10);
  puVar23 = (ushort *)((long)puVar22 + uStack_90 + 4);
  bVar4 = *(byte *)((long)puVar15 + uVar17 + 2);
  puVar15 = (ushort *)((long)puVar15 + uVar17 + 3);
  goto LAB_00103291;
}

Assistant:

LZ4_FORCE_O2_GCC_PPC64LE /* Exported, an obsolete API function. */
int LZ4_decompress_safe_withPrefix64k(const char* source, char* dest, int compressedSize, int maxOutputSize)
{
    return LZ4_decompress_generic(source, dest, compressedSize, maxOutputSize,
                                  endOnInputSize, decode_full_block, withPrefix64k,
                                  (BYTE*)dest - 64 KB, NULL, 0);
}